

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raft_server.cxx
# Opt level: O2

void __thiscall nuraft::raft_server::raft_server(raft_server *this,context *ctx,init_options *opt)

{
  __shared_ptr<nuraft::state_machine,_(__gnu_cxx::_Lock_policy)2> *p_Var1;
  ptr<log_store> *ppVar2;
  ptr<logger> *this_00;
  _Rb_tree_header *p_Var3;
  stringstream sVar4;
  element_type *peVar5;
  element_type *peVar6;
  undefined8 this_01;
  int32 iVar7;
  uint32_t uVar8;
  int iVar9;
  unsigned_long __res;
  __int_type _Var10;
  ulong uVar11;
  EventAwaiter *pEVar12;
  uint64_t uVar13;
  stringstream *psVar14;
  long lVar15;
  element_type *peVar16;
  ostream *poVar17;
  ulong uVar18;
  stringstream *psVar19;
  char *pcVar20;
  _List_node_base *p_Var21;
  ulong uVar22;
  shared_ptr<nuraft::peer> sVar23;
  ptr<srv_config> cur_srv;
  uniform_int_distribution<int> distribution;
  _Head_base<0UL,_nuraft::raft_server_*,_false> a_Stack_408 [2];
  default_random_engine engine;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_3f0 [3];
  ptr<cluster_config> c_conf;
  ptr<raft_params> params;
  shared_ptr<nuraft::srv_config> local_3a8;
  rpc_handler *local_398;
  time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
  local_390;
  condition_variable *local_388;
  condition_variable *local_380;
  undefined1 local_378 [24];
  function<nuraft::cb_func::ReturnCode_(nuraft::cb_func::Type,_nuraft::cb_func::Param_*)> local_360;
  stringstream init_msg;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_338;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_330 [23];
  stringstream peer_info_msg;
  stringstream asStack_1b1 [9];
  ostream local_1a8 [376];
  
  (this->super_enable_shared_from_this<nuraft::raft_server>)._M_weak_this.
  super___weak_ptr<nuraft::raft_server,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0;
  (this->super_enable_shared_from_this<nuraft::raft_server>)._M_weak_this.
  super___weak_ptr<nuraft::raft_server,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  this->_vptr_raft_server = (_func_int **)&PTR__raft_server_00165550;
  (this->bg_commit_thread_)._M_id._M_thread = 0;
  (this->bg_append_thread_)._M_id._M_thread = 0;
  *(undefined8 *)((long)&(this->bg_append_thread_)._M_id._M_thread + 1) = 0;
  *(undefined8 *)((long)&this->bg_append_ea_ + 1) = 0;
  (this->leader_).super___atomic_base<int>._M_i = -1;
  iVar7 = (**(code **)(**(long **)ctx + 0x38))();
  this->id_ = iVar7;
  this->target_priority_ = 1;
  timer_helper::timer_helper(&this->priority_change_timer_,0,false);
  this->votes_responded_ = 0;
  this->votes_granted_ = 0;
  (this->leader_commit_index_).super___atomic_base<unsigned_long>._M_i = 0;
  _Var10 = (**(code **)(**(long **)(ctx + 0x10) + 0x88))();
  p_Var1 = (__shared_ptr<nuraft::state_machine,_(__gnu_cxx::_Lock_policy)2> *)(ctx + 0x10);
  (this->quick_commit_index_).super___atomic_base<unsigned_long>._M_i = _Var10;
  _Var10 = (**(code **)(*(long *)p_Var1->_M_ptr + 0x88))();
  (this->sm_commit_index_).super___atomic_base<unsigned_long>._M_i = _Var10;
  uVar11 = (**(code **)(*(long *)p_Var1->_M_ptr + 0x88))();
  this->initial_commit_index_ = uVar11;
  (this->hb_alive_)._M_base._M_i = false;
  (this->pre_vote_).quorum_reject_count_ = (__atomic_base<int>)0x0;
  (this->pre_vote_).failure_count_ = (__atomic_base<int>)0x0;
  (this->pre_vote_).term_ = 0;
  LOCK();
  (this->pre_vote_).done_._M_base._M_i = false;
  UNLOCK();
  LOCK();
  (this->pre_vote_).abandoned_.super___atomic_base<int>._M_i = 0;
  UNLOCK();
  LOCK();
  (this->pre_vote_).dead_.super___atomic_base<int>._M_i = 0;
  UNLOCK();
  LOCK();
  (this->pre_vote_).live_.super___atomic_base<int>._M_i = 0;
  UNLOCK();
  this->election_completed_ = true;
  this->config_changing_ = false;
  this->catching_up_ = (__atomic_base<bool>)0x0;
  this->out_of_log_range_ = (__atomic_base<bool>)0x0;
  this->data_fresh_ = (__atomic_base<bool>)0x0;
  this->stopping_ = (__atomic_base<bool>)0x0;
  this->commit_bg_stopped_ = (__atomic_base<bool>)0x0;
  this->append_bg_stopped_ = (__atomic_base<bool>)0x0;
  this->write_paused_ = (__atomic_base<bool>)0x0;
  this->sm_commit_paused_ = (__atomic_base<bool>)0x0;
  this->sm_commit_exec_in_progress_ = (__atomic_base<bool>)0x0;
  pEVar12 = (EventAwaiter *)operator_new(0x60);
  EventAwaiter::EventAwaiter(pEVar12);
  this->ea_sm_commit_exec_in_progress_ = pEVar12;
  (this->next_leader_candidate_).super___atomic_base<int>._M_i = -1;
  timer_helper::timer_helper(&this->reelection_timer_,0,false);
  this->im_learner_ = false;
  this->serving_req_ = (__atomic_base<bool>)0x0;
  this->steps_to_down_ = 0;
  (this->snp_in_progress_)._M_base._M_i = false;
  (this->ctx_)._M_t.super___uniq_ptr_impl<nuraft::context,_std::default_delete<nuraft::context>_>.
  _M_t.super__Tuple_impl<0UL,_nuraft::context_*,_std::default_delete<nuraft::context>_>.
  super__Head_base<0UL,_nuraft::context_*,_false>._M_head_impl = ctx;
  std::__shared_ptr<nuraft::delayed_task_scheduler,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&(this->scheduler_).
              super___shared_ptr<nuraft::delayed_task_scheduler,_(__gnu_cxx::_Lock_policy)2>,
             (__shared_ptr<nuraft::delayed_task_scheduler,_(__gnu_cxx::_Lock_policy)2> *)
             (ctx + 0x50));
  local_378._8_8_ = &this->election_exec_;
  _init_msg = handle_election_timeout;
  local_338._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_330[0]._0_8_ = this;
  std::function<void()>::
  function<std::_Bind<void(nuraft::raft_server::*(nuraft::raft_server*))()>,void>
            ((function<void()> *)local_378._8_8_,
             (_Bind<void_(nuraft::raft_server::*(nuraft::raft_server_*))()> *)&init_msg);
  (this->election_task_).super___shared_ptr<nuraft::delayed_task,_(__gnu_cxx::_Lock_policy)2>._M_ptr
       = (element_type *)0x0;
  (this->election_task_).super___shared_ptr<nuraft::delayed_task,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  timer_helper::timer_helper(&this->last_election_timer_reset_,0,false);
  (this->peers_)._M_h._M_buckets = &(this->peers_)._M_h._M_single_bucket;
  (this->peers_)._M_h._M_bucket_count = 1;
  (this->peers_)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->peers_)._M_h._M_element_count = 0;
  (this->peers_)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->peers_)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->peers_)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  (this->rpc_clients_)._M_h._M_buckets = &(this->rpc_clients_)._M_h._M_single_bucket;
  (this->rpc_clients_)._M_h._M_bucket_count = 1;
  (this->rpc_clients_)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->rpc_clients_)._M_h._M_element_count = 0;
  (this->rpc_clients_)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->rpc_clients_)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->rpc_clients_)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  (this->auto_fwd_pkgs_)._M_h._M_buckets = &(this->auto_fwd_pkgs_)._M_h._M_single_bucket;
  (this->auto_fwd_pkgs_)._M_h._M_bucket_count = 1;
  (this->auto_fwd_pkgs_)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->auto_fwd_pkgs_)._M_h._M_element_count = 0;
  (this->auto_fwd_pkgs_)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->auto_fwd_pkgs_)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->auto_fwd_pkgs_)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  local_378._0_8_ = &this->auto_fwd_reqs_;
  (this->auto_fwd_reqs_).
  super__List_base<nuraft::raft_server::auto_fwd_req_resp,_std::allocator<nuraft::raft_server::auto_fwd_req_resp>_>
  ._M_impl._M_node.super__List_node_base._M_prev = (_List_node_base *)local_378._0_8_;
  (this->auto_fwd_reqs_).
  super__List_base<nuraft::raft_server::auto_fwd_req_resp,_std::allocator<nuraft::raft_server::auto_fwd_req_resp>_>
  ._M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)local_378._0_8_;
  (this->auto_fwd_reqs_).
  super__List_base<nuraft::raft_server::auto_fwd_req_resp,_std::allocator<nuraft::raft_server::auto_fwd_req_resp>_>
  ._M_impl._M_node._M_size = 0;
  (this->auto_fwd_reqs_lock_).super___mutex_base._M_mutex.__align = 0;
  *(undefined8 *)((long)&(this->auto_fwd_reqs_lock_).super___mutex_base._M_mutex + 8) = 0;
  *(undefined8 *)((long)&(this->auto_fwd_reqs_lock_).super___mutex_base._M_mutex + 0x10) = 0;
  (this->auto_fwd_reqs_lock_).super___mutex_base._M_mutex.__data.__list.__prev =
       (__pthread_internal_list *)0x0;
  (this->auto_fwd_reqs_lock_).super___mutex_base._M_mutex.__data.__list.__next =
       (__pthread_internal_list *)0x0;
  (this->role_)._M_i = follower;
  (**(code **)(**(long **)ctx + 0x28))(&this->state_);
  ppVar2 = &this->log_store_;
  (**(code **)(**(long **)ctx + 0x30))(ppVar2);
  std::__shared_ptr<nuraft::state_machine,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&(this->state_machine_).
              super___shared_ptr<nuraft::state_machine,_(__gnu_cxx::_Lock_policy)2>,p_Var1);
  (this->receiving_snapshot_)._M_base._M_i = false;
  (this->et_cnt_receiving_snapshot_).super___atomic_base<unsigned_long>._M_i = 0;
  this->first_snapshot_distance_ = 0;
  this_00 = &this->l_;
  std::__shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&this_00->super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>,
             (__shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2> *)(ctx + 0x30));
  (this->stale_config_).super___shared_ptr<nuraft::cluster_config,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = (element_type *)0x0;
  (this->stale_config_).super___shared_ptr<nuraft::cluster_config,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->rand_timeout_).super__Function_base._M_manager = (_Manager_type)0x0;
  (this->rand_timeout_)._M_invoker = (_Invoker_type)0x0;
  *(undefined8 *)&(this->rand_timeout_).super__Function_base._M_functor = 0;
  *(undefined8 *)((long)&(this->rand_timeout_).super__Function_base._M_functor + 8) = 0;
  (**(code **)(**(long **)ctx + 0x10))(&this->config_);
  *(undefined8 *)
   ((long)&(this->srv_to_join_).super___shared_ptr<nuraft::peer,_(__gnu_cxx::_Lock_policy)2>._M_ptr
   + 1) = 0;
  *(undefined8 *)
   ((long)&(this->srv_to_join_).super___shared_ptr<nuraft::peer,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi + 1) = 0;
  (this->uncommitted_config_).super___shared_ptr<nuraft::cluster_config,_(__gnu_cxx::_Lock_policy)2>
  ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->srv_to_join_).super___shared_ptr<nuraft::peer,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (this->config_lock_).super___mutex_base._M_mutex.__data.__list.__next =
       (__pthread_internal_list *)0x0;
  (this->uncommitted_config_).super___shared_ptr<nuraft::cluster_config,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr = (element_type *)0x0;
  *(undefined8 *)((long)&(this->config_lock_).super___mutex_base._M_mutex + 0x10) = 0;
  (this->config_lock_).super___mutex_base._M_mutex.__data.__list.__prev =
       (__pthread_internal_list *)0x0;
  (this->config_lock_).super___mutex_base._M_mutex.__align = 0;
  *(undefined8 *)((long)&(this->config_lock_).super___mutex_base._M_mutex + 8) = 0;
  *(undefined8 *)((long)&(this->lock_).super___recursive_mutex_base._M_mutex + 8) = 0;
  *(undefined8 *)((long)&(this->lock_).super___recursive_mutex_base._M_mutex + 0x10) = 0;
  (this->srv_to_leave_).super___shared_ptr<nuraft::peer,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (this->srv_to_leave_).super___shared_ptr<nuraft::peer,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  this->srv_to_leave_target_idx_ = 0;
  (this->conf_to_add_).super___shared_ptr<nuraft::srv_config,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (this->conf_to_add_).super___shared_ptr<nuraft::srv_config,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->lock_).super___recursive_mutex_base._M_mutex.__align = 0;
  (this->lock_).super___recursive_mutex_base._M_mutex.__data.__list.__prev =
       (__pthread_internal_list *)0x0;
  (this->lock_).super___recursive_mutex_base._M_mutex.__data.__list.__next =
       (__pthread_internal_list *)0x0;
  (this->lock_).super___recursive_mutex_base._M_mutex.__data.__kind = 1;
  (this->cli_lock_).super___mutex_base._M_mutex.__align = 0;
  *(undefined8 *)((long)&(this->cli_lock_).super___mutex_base._M_mutex + 8) = 0;
  *(undefined8 *)((long)&(this->cli_lock_).super___mutex_base._M_mutex + 0x10) = 0;
  (this->cli_lock_).super___mutex_base._M_mutex.__data.__list.__prev =
       (__pthread_internal_list *)0x0;
  (this->cli_lock_).super___mutex_base._M_mutex.__data.__list.__next =
       (__pthread_internal_list *)0x0;
  local_380 = &this->commit_cv_;
  std::condition_variable::condition_variable(local_380);
  (this->commit_ret_elems_)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  p_Var3 = &(this->commit_ret_elems_)._M_t._M_impl.super__Rb_tree_header;
  (this->commit_ret_elems_)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->commit_cv_lock_).super___mutex_base._M_mutex.__align = 0;
  *(undefined8 *)((long)&(this->commit_cv_lock_).super___mutex_base._M_mutex + 8) = 0;
  *(undefined8 *)((long)&(this->commit_cv_lock_).super___mutex_base._M_mutex + 0x10) = 0;
  (this->commit_cv_lock_).super___mutex_base._M_mutex.__data.__list.__prev =
       (__pthread_internal_list *)0x0;
  (this->commit_cv_lock_).super___mutex_base._M_mutex.__data.__list.__next =
       (__pthread_internal_list *)0x0;
  (this->commit_lock_).super___mutex_base._M_mutex.__align = 0;
  *(undefined8 *)((long)&(this->commit_lock_).super___mutex_base._M_mutex + 8) = 0;
  *(undefined8 *)((long)&(this->commit_lock_).super___mutex_base._M_mutex + 0x10) = 0;
  (this->commit_lock_).super___mutex_base._M_mutex.__data.__list.__prev =
       (__pthread_internal_list *)0x0;
  (this->commit_lock_).super___mutex_base._M_mutex.__data.__list.__next =
       (__pthread_internal_list *)0x0;
  (this->rpc_clients_lock_).super___mutex_base._M_mutex.__data.__list.__next =
       (__pthread_internal_list *)0x0;
  (this->rpc_clients_lock_).super___mutex_base._M_mutex.__align = 0;
  *(undefined8 *)((long)&(this->rpc_clients_lock_).super___mutex_base._M_mutex + 8) = 0;
  *(undefined8 *)((long)&(this->rpc_clients_lock_).super___mutex_base._M_mutex + 0x10) = 0;
  (this->rpc_clients_lock_).super___mutex_base._M_mutex.__data.__list.__prev =
       (__pthread_internal_list *)0x0;
  (this->commit_ret_elems_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var3->_M_header;
  (this->commit_ret_elems_)._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var3->_M_header;
  local_388 = &this->ready_to_stop_cv_;
  (this->commit_ret_elems_)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  (this->commit_ret_elems_lock_).super___mutex_base._M_mutex.__align = 0;
  *(undefined8 *)((long)&(this->commit_ret_elems_lock_).super___mutex_base._M_mutex + 8) = 0;
  *(undefined8 *)((long)&(this->commit_ret_elems_lock_).super___mutex_base._M_mutex + 0x10) = 0;
  (this->commit_ret_elems_lock_).super___mutex_base._M_mutex.__data.__list.__prev =
       (__pthread_internal_list *)0x0;
  (this->commit_ret_elems_lock_).super___mutex_base._M_mutex.__data.__list.__next =
       (__pthread_internal_list *)0x0;
  std::condition_variable::condition_variable(local_388);
  *(undefined8 *)((long)&(this->ready_to_stop_cv_lock_).super___mutex_base._M_mutex + 0x10) = 0;
  (this->ready_to_stop_cv_lock_).super___mutex_base._M_mutex.__data.__list.__prev =
       (__pthread_internal_list *)0x0;
  (this->ready_to_stop_cv_lock_).super___mutex_base._M_mutex.__align = 0;
  *(undefined8 *)((long)&(this->ready_to_stop_cv_lock_).super___mutex_base._M_mutex + 8) = 0;
  (this->ready_to_stop_cv_lock_).super___mutex_base._M_mutex.__data.__list.__next =
       (__pthread_internal_list *)0x0;
  local_390.__d.__r = (duration)&this->resp_handler_;
  _init_msg = handle_peer_resp;
  local_338._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_330[0]._0_8_ = this;
  std::function<void(std::shared_ptr<nuraft::resp_msg>&,std::shared_ptr<nuraft::rpc_exception>&)>::
  function<std::_Bind<void(nuraft::raft_server::*(nuraft::raft_server*,std::_Placeholder<1>,std::_Placeholder<2>))(std::shared_ptr<nuraft::resp_msg>&,std::shared_ptr<nuraft::rpc_exception>&)>,void>
            ((function<void(std::shared_ptr<nuraft::resp_msg>&,std::shared_ptr<nuraft::rpc_exception>&)>
              *)local_390.__d.__r,
             (_Bind<void_(nuraft::raft_server::*(nuraft::raft_server_*,_std::_Placeholder<1>,_std::_Placeholder<2>))(std::shared_ptr<nuraft::resp_msg>_&,_std::shared_ptr<nuraft::rpc_exception>_&)>
              *)&init_msg);
  local_398 = &this->ex_resp_handler_;
  _init_msg = handle_ext_resp;
  local_338._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_330[0]._0_8_ = this;
  std::function<void(std::shared_ptr<nuraft::resp_msg>&,std::shared_ptr<nuraft::rpc_exception>&)>::
  function<std::_Bind<void(nuraft::raft_server::*(nuraft::raft_server*,std::_Placeholder<1>,std::_Placeholder<2>))(std::shared_ptr<nuraft::resp_msg>&,std::shared_ptr<nuraft::rpc_exception>&)>,void>
            ((function<void(std::shared_ptr<nuraft::resp_msg>&,std::shared_ptr<nuraft::rpc_exception>&)>
              *)local_398,
             (_Bind<void_(nuraft::raft_server::*(nuraft::raft_server_*,_std::_Placeholder<1>,_std::_Placeholder<2>))(std::shared_ptr<nuraft::resp_msg>_&,_std::shared_ptr<nuraft::rpc_exception>_&)>
              *)&init_msg);
  local_378._16_8_ = &this->state_;
  (**(code **)(*(long *)p_Var1->_M_ptr + 0x80))(&this->last_snapshot_);
  *(undefined8 *)((long)&(this->last_snapshot_lock_).super___mutex_base._M_mutex + 0x10) = 0;
  (this->last_snapshot_lock_).super___mutex_base._M_mutex.__data.__list.__prev =
       (__pthread_internal_list *)0x0;
  (this->last_snapshot_lock_).super___mutex_base._M_mutex.__align = 0;
  *(undefined8 *)((long)&(this->last_snapshot_lock_).super___mutex_base._M_mutex + 8) = 0;
  (this->last_snapshot_lock_).super___mutex_base._M_mutex.__data.__list.__next =
       (__pthread_internal_list *)0x0;
  timer_helper::timer_helper(&this->leadership_transfer_timer_,0,false);
  timer_helper::timer_helper(&this->status_check_timer_,0,false);
  timer_helper::timer_helper(&this->vote_init_timer_,0,false);
  pEVar12 = (EventAwaiter *)operator_new(0x60);
  EventAwaiter::EventAwaiter(pEVar12);
  this->ea_follower_log_append_ = pEVar12;
  (this->test_mode_flag_)._M_base._M_i = (__int_type_conflict)opt[0x29];
  if (*(long *)(opt + 0x18) != 0) {
    std::function<nuraft::cb_func::ReturnCode_(nuraft::cb_func::Type,_nuraft::cb_func::Param_*)>::
    function((function<nuraft::cb_func::ReturnCode_(nuraft::cb_func::Type,_nuraft::cb_func::Param_*)>
              *)(local_378 + 0x18),
             (function<nuraft::cb_func::ReturnCode_(nuraft::cb_func::Type,_nuraft::cb_func::Param_*)>
              *)(opt + 8));
    context::set_cb_func(ctx,(func_type *)(local_378 + 0x18));
    std::_Function_base::~_Function_base((_Function_base *)(local_378 + 0x18));
  }
  context::get_params((context *)&params);
  this_01 = local_378._16_8_;
  if (*(int *)(params.super___shared_ptr<nuraft::raft_params,_(__gnu_cxx::_Lock_policy)2>._M_ptr +
              0x34) <
      *(int *)(params.super___shared_ptr<nuraft::raft_params,_(__gnu_cxx::_Lock_policy)2>._M_ptr +
              0x30)) {
    *(int *)(params.super___shared_ptr<nuraft::raft_params,_(__gnu_cxx::_Lock_policy)2>._M_ptr +
            0x34) =
         *(int *)(params.super___shared_ptr<nuraft::raft_params,_(__gnu_cxx::_Lock_policy)2>._M_ptr
                 + 0x30);
  }
  if (params.super___shared_ptr<nuraft::raft_params,_(__gnu_cxx::_Lock_policy)2>._M_ptr[0x20] ==
      (element_type)0x1) {
    get_last_snapshot((raft_server *)&init_msg);
    if ((_func_int **)_init_msg == (_func_int **)0x0) {
      iVar9 = *(int *)(params.super___shared_ptr<nuraft::raft_params,_(__gnu_cxx::_Lock_policy)2>.
                       _M_ptr + 0x18);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_338);
      if (1 < iVar9) {
        uVar13 = timer_helper::get_timeofday_us();
        psVar19 = &peer_info_msg;
        _peer_info_msg = (pointer)(uVar13 * (long)this->id_);
        for (psVar14 = asStack_1b1; (psVar14 + 1 != psVar19 && (psVar14 != psVar19));
            psVar14 = psVar14 + -1) {
          sVar4 = *psVar19;
          *psVar19 = *psVar14;
          psVar19 = psVar19 + 1;
          *psVar14 = sVar4;
        }
        engine._M_x = (ulong)_peer_info_msg % 0x7fffffff +
                      (ulong)((ulong)_peer_info_msg % 0x7fffffff == 0);
        distribution._M_param._M_a =
             *(int *)(params.super___shared_ptr<nuraft::raft_params,_(__gnu_cxx::_Lock_policy)2>.
                      _M_ptr + 0x18) / 2;
        distribution._M_param._M_b =
             *(int *)(params.super___shared_ptr<nuraft::raft_params,_(__gnu_cxx::_Lock_policy)2>.
                      _M_ptr + 0x18) + -1;
        if (distribution._M_param._M_b < distribution._M_param._M_a) {
          distribution._M_param._M_b = distribution._M_param._M_a;
        }
        uVar8 = std::uniform_int_distribution<int>::operator()(&distribution,&engine);
        this->first_snapshot_distance_ = uVar8;
        peVar5 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
        if (peVar5 != (element_type *)0x0) {
          iVar9 = (**(code **)(*(long *)peVar5 + 0x38))();
          if (3 < iVar9) {
            peVar5 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>.
                     _M_ptr;
            msg_if_given_abi_cxx11_
                      ((string *)&init_msg,"First snapshot creation log distance %u",
                       (ulong)this->first_snapshot_distance_);
            (**(code **)(*(long *)peVar5 + 0x40))
                      (peVar5,4,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/raft_server.cxx"
                       ,"raft_server",0x89,&init_msg);
            std::__cxx11::string::~string((string *)&init_msg);
          }
        }
      }
    }
    else {
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_338);
    }
  }
  apply_and_log_current_params(this);
  update_rand_timeout(this);
  lVar15 = (**(code **)(*(long *)(ppVar2->
                                 super___shared_ptr<nuraft::log_store,_(__gnu_cxx::_Lock_policy)2>).
                                 _M_ptr + 0x10))();
  LOCK();
  (this->precommit_index_).super___atomic_base<unsigned_long>._M_i = lVar15 - 1;
  UNLOCK();
  lVar15 = (**(code **)(*(long *)(this->log_store_).
                                 super___shared_ptr<nuraft::log_store,_(__gnu_cxx::_Lock_policy)2>.
                                 _M_ptr + 0x10))();
  LOCK();
  (this->lagging_sm_target_index_).super___atomic_base<unsigned_long>._M_i = lVar15 - 1;
  UNLOCK();
  peVar16 = (this->state_).super___shared_ptr<nuraft::srv_state,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  if (peVar16 == (element_type *)0x0) {
    std::make_shared<nuraft::srv_state>();
    std::__shared_ptr<nuraft::srv_state,_(__gnu_cxx::_Lock_policy)2>::operator=
              ((__shared_ptr<nuraft::srv_state,_(__gnu_cxx::_Lock_policy)2> *)this_01,
               (__shared_ptr<nuraft::srv_state,_(__gnu_cxx::_Lock_policy)2> *)&init_msg);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_338);
    LOCK();
    *(undefined8 *)(*(long *)this_01 + 8) = 0;
    UNLOCK();
    LOCK();
    *(undefined4 *)(*(long *)this_01 + 0x10) = 0xffffffff;
    UNLOCK();
    peVar16 = *(element_type **)this_01;
  }
  LOCK();
  (this->vote_init_timer_term_).super___atomic_base<unsigned_long>._M_i =
       (peVar16->term_).super___atomic_base<unsigned_long>._M_i;
  UNLOCK();
  get_config((raft_server *)&c_conf);
  std::__cxx11::stringstream::stringstream((stringstream *)&init_msg);
  poVar17 = std::operator<<((ostream *)local_330[0]._M_local_buf,"   === INIT RAFT SERVER ===\n");
  poVar17 = std::operator<<(poVar17,"commit index ");
  poVar17 = std::ostream::_M_insert<unsigned_long>((ulong)poVar17);
  poVar17 = std::operator<<(poVar17,"\n");
  poVar17 = std::operator<<(poVar17,"term ");
  poVar17 = std::ostream::_M_insert<unsigned_long>((ulong)poVar17);
  poVar17 = std::operator<<(poVar17,"\n");
  poVar17 = std::operator<<(poVar17,"election timer ");
  pcVar20 = "not allowed";
  if ((*(byte *)(*(long *)this_01 + 0x14) & 1) != 0) {
    pcVar20 = "allowed";
  }
  poVar17 = std::operator<<(poVar17,pcVar20);
  poVar17 = std::operator<<(poVar17,"\n");
  poVar17 = std::operator<<(poVar17,"log store start ");
  (**(code **)(*(long *)(ppVar2->super___shared_ptr<nuraft::log_store,_(__gnu_cxx::_Lock_policy)2>).
                        _M_ptr + 0x18))();
  poVar17 = std::ostream::_M_insert<unsigned_long>((ulong)poVar17);
  poVar17 = std::operator<<(poVar17,", end ");
  (**(code **)(*(long *)(ppVar2->super___shared_ptr<nuraft::log_store,_(__gnu_cxx::_Lock_policy)2>).
                        _M_ptr + 0x10))();
  poVar17 = std::ostream::_M_insert<unsigned_long>((ulong)poVar17);
  poVar17 = std::operator<<(poVar17,"\n");
  poVar17 = std::operator<<(poVar17,"config log idx ");
  poVar17 = std::ostream::_M_insert<unsigned_long>((ulong)poVar17);
  poVar17 = std::operator<<(poVar17,", prev log idx ");
  poVar17 = std::ostream::_M_insert<unsigned_long>((ulong)poVar17);
  std::operator<<(poVar17,"\n");
  if ((c_conf.super___shared_ptr<nuraft::cluster_config,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
      async_replication_ == true) {
    std::operator<<((ostream *)local_330[0]._M_local_buf," -- ASYNC REPLICATION --\n");
  }
  peVar5 = (this_00->super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  if (peVar5 != (element_type *)0x0) {
    iVar9 = (**(code **)(*(long *)peVar5 + 0x38))();
    if (3 < iVar9) {
      peVar5 = (this_00->super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
      std::__cxx11::stringbuf::str();
      msg_if_given_abi_cxx11_((string *)&peer_info_msg,"%s",engine._M_x);
      (**(code **)(*(long *)peVar5 + 0x40))
                (peVar5,4,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/raft_server.cxx"
                 ,"raft_server",0xa6,&peer_info_msg);
      std::__cxx11::string::~string((string *)&peer_info_msg);
      std::__cxx11::string::~string((string *)&engine);
    }
  }
  _Var10 = (this->sm_commit_index_).super___atomic_base<unsigned_long>._M_i;
  uVar18 = (**(code **)(*(long *)(this->log_store_).
                                 super___shared_ptr<nuraft::log_store,_(__gnu_cxx::_Lock_policy)2>.
                                 _M_ptr + 0x18))();
  uVar22 = _Var10 + 1;
  if (uVar22 <= uVar18) {
    uVar22 = uVar18;
  }
  do {
    uVar18 = (**(code **)(*(long *)(ppVar2->
                                   super___shared_ptr<nuraft::log_store,_(__gnu_cxx::_Lock_policy)2>
                                   )._M_ptr + 0x10))();
    if (uVar18 <= uVar22) {
LAB_0011b5cb:
      std::__cxx11::stringstream::stringstream((stringstream *)&peer_info_msg);
      p_Var21 = (_List_node_base *)
                &(c_conf.super___shared_ptr<nuraft::cluster_config,_(__gnu_cxx::_Lock_policy)2>.
                 _M_ptr)->servers_;
      while( true ) {
        p_Var21 = (((_List_base<std::shared_ptr<nuraft::srv_config>,_std::allocator<std::shared_ptr<nuraft::srv_config>_>_>
                     *)&p_Var21->_M_next)->_M_impl)._M_node.super__List_node_base._M_next;
        if (p_Var21 ==
            (_List_node_base *)
            &(c_conf.super___shared_ptr<nuraft::cluster_config,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
             ->servers_) break;
        std::__shared_ptr<nuraft::srv_config,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                  (&cur_srv.super___shared_ptr<nuraft::srv_config,_(__gnu_cxx::_Lock_policy)2>,
                   (__shared_ptr<nuraft::srv_config,_(__gnu_cxx::_Lock_policy)2> *)(p_Var21 + 1));
        if ((cur_srv.super___shared_ptr<nuraft::srv_config,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->id_
            == this->id_) {
          this->im_learner_ =
               (cur_srv.super___shared_ptr<nuraft::srv_config,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
               learner_;
          this->my_priority_ =
               (cur_srv.super___shared_ptr<nuraft::srv_config,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
               priority_;
        }
        else {
          distribution._M_param = (param_type)handle_hb_timeout;
          a_Stack_408[0]._M_head_impl = this;
          std::function<void(int)>::
          function<std::_Bind<void(nuraft::raft_server::*(nuraft::raft_server*,std::_Placeholder<1>))(int)>,void>
                    ((function<void(int)> *)&engine,
                     (_Bind<void_(nuraft::raft_server::*(nuraft::raft_server_*,_std::_Placeholder<1>))(int)>
                      *)&distribution);
          iVar7 = (cur_srv.super___shared_ptr<nuraft::srv_config,_(__gnu_cxx::_Lock_policy)2>._M_ptr
                  )->id_;
          sVar23 = std::
                   make_shared<nuraft::peer,std::shared_ptr<nuraft::srv_config>&,nuraft::context&,std::function<void(int)>&,std::shared_ptr<nuraft::logger>&>
                             (&local_3a8,(context *)&cur_srv,
                              (function<void_(int)> *)
                              (this->ctx_)._M_t.
                              super___uniq_ptr_impl<nuraft::context,_std::default_delete<nuraft::context>_>
                              ._M_t.
                              super__Tuple_impl<0UL,_nuraft::context_*,_std::default_delete<nuraft::context>_>
                              .super__Head_base<0UL,_nuraft::context_*,_false>._M_head_impl,
                              (shared_ptr<nuraft::logger> *)&engine);
          distribution._M_param._M_a = iVar7;
          a_Stack_408[0]._M_head_impl =
               (raft_server *)
               local_3a8.super___shared_ptr<nuraft::srv_config,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi;
          local_3a8.super___shared_ptr<nuraft::srv_config,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
               (element_type *)0x0;
          local_3a8.super___shared_ptr<nuraft::srv_config,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
          _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
          std::
          _Hashtable<int,std::pair<int_const,std::shared_ptr<nuraft::peer>>,std::allocator<std::pair<int_const,std::shared_ptr<nuraft::peer>>>,std::__detail::_Select1st,std::equal_to<int>,std::hash<int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
          ::_M_emplace<std::pair<int,std::shared_ptr<nuraft::peer>>>
                    ((_Hashtable<int,std::pair<int_const,std::shared_ptr<nuraft::peer>>,std::allocator<std::pair<int_const,std::shared_ptr<nuraft::peer>>>,std::__detail::_Select1st,std::equal_to<int>,std::hash<int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
                      *)&this->peers_,&distribution,
                     sVar23.super___shared_ptr<nuraft::peer,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                     ._M_pi._M_pi);
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                    ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)a_Stack_408);
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                    (&local_3a8.super___shared_ptr<nuraft::srv_config,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount);
          std::_Function_base::~_Function_base((_Function_base *)&engine);
        }
        poVar17 = std::operator<<(local_1a8,"peer ");
        poVar17 = (ostream *)
                  std::ostream::operator<<
                            ((ostream *)poVar17,
                             (cur_srv.
                              super___shared_ptr<nuraft::srv_config,_(__gnu_cxx::_Lock_policy)2>.
                             _M_ptr)->id_);
        poVar17 = std::operator<<(poVar17,": DC ID ");
        poVar17 = (ostream *)
                  std::ostream::operator<<
                            ((ostream *)poVar17,
                             (cur_srv.
                              super___shared_ptr<nuraft::srv_config,_(__gnu_cxx::_Lock_policy)2>.
                             _M_ptr)->dc_id_);
        poVar17 = std::operator<<(poVar17,", ");
        poVar17 = std::operator<<(poVar17,(string *)
                                          &(cur_srv.
                                            super___shared_ptr<nuraft::srv_config,_(__gnu_cxx::_Lock_policy)2>
                                           ._M_ptr)->endpoint_);
        poVar17 = std::operator<<(poVar17,", ");
        pcVar20 = "voting member";
        if ((cur_srv.super___shared_ptr<nuraft::srv_config,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
            learner_ != false) {
          pcVar20 = "learner";
        }
        poVar17 = std::operator<<(poVar17,pcVar20);
        poVar17 = std::operator<<(poVar17,", ");
        poVar17 = (ostream *)
                  std::ostream::operator<<
                            ((ostream *)poVar17,
                             (cur_srv.
                              super___shared_ptr<nuraft::srv_config,_(__gnu_cxx::_Lock_policy)2>.
                             _M_ptr)->priority_);
        std::endl<char,std::char_traits<char>>(poVar17);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  (&cur_srv.super___shared_ptr<nuraft::srv_config,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount);
      }
      poVar17 = std::operator<<(local_1a8,"my id: ");
      poVar17 = (ostream *)std::ostream::operator<<((ostream *)poVar17,this->id_);
      poVar17 = std::operator<<(poVar17,", ");
      pcVar20 = "voting_member";
      if (this->im_learner_ != false) {
        pcVar20 = "learner";
      }
      poVar17 = std::operator<<(poVar17,pcVar20);
      std::endl<char,std::char_traits<char>>(poVar17);
      poVar17 = std::operator<<(local_1a8,"num peers: ");
      poVar17 = std::ostream::_M_insert<unsigned_long>((ulong)poVar17);
      std::endl<char,std::char_traits<char>>(poVar17);
      peVar5 = (this_00->super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
      if (peVar5 != (element_type *)0x0) {
        iVar9 = (**(code **)(*(long *)peVar5 + 0x38))();
        if (3 < iVar9) {
          peVar5 = (this_00->super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
          std::__cxx11::stringbuf::str();
          msg_if_given_abi_cxx11_((string *)&engine,"%s",distribution._M_param);
          (**(code **)(*(long *)peVar5 + 0x40))
                    (peVar5,4,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/raft_server.cxx"
                     ,"raft_server",0x101,&engine);
          std::__cxx11::string::~string((string *)&engine);
          std::__cxx11::string::~string((string *)&distribution);
        }
      }
      if (opt[0x28] == (init_options)0x1) {
        start_server(this,(bool)*opt);
      }
      std::__cxx11::stringstream::~stringstream((stringstream *)&peer_info_msg);
      std::__cxx11::stringstream::~stringstream((stringstream *)&init_msg);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                (&c_conf.super___shared_ptr<nuraft::cluster_config,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                (&params.super___shared_ptr<nuraft::raft_params,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount);
      return;
    }
    peVar6 = (ppVar2->super___shared_ptr<nuraft::log_store,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
    (**(code **)(*(long *)peVar6 + 0x50))(&engine,peVar6,uVar22);
    if (*(char *)(engine._M_x + 8) == '\x02') {
      peVar5 = (this_00->super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
      if (peVar5 != (element_type *)0x0) {
        iVar9 = (**(code **)(*(long *)peVar5 + 0x38))();
        if (3 < iVar9) {
          peVar5 = (this_00->super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
          msg_if_given_abi_cxx11_
                    ((string *)&peer_info_msg,
                     "detect a configuration change that is not committed yet at index %lu",uVar22);
          (**(code **)(*(long *)peVar5 + 0x40))
                    (peVar5,4,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/raft_server.cxx"
                     ,"raft_server",0xca,&peer_info_msg);
          std::__cxx11::string::~string((string *)&peer_info_msg);
        }
      }
      this->config_changing_ = true;
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(local_3f0);
      goto LAB_0011b5cb;
    }
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(local_3f0);
    uVar22 = uVar22 + 1;
  } while( true );
}

Assistant:

raft_server::raft_server(context* ctx, const init_options& opt)
    : bg_append_ea_(nullptr)
    , initialized_(false)
    , leader_(-1)
    , id_(ctx->state_mgr_->server_id())
    , target_priority_(srv_config::INIT_PRIORITY)
    , votes_responded_(0)
    , votes_granted_(0)
    , leader_commit_index_(0)
    , quick_commit_index_(ctx->state_machine_->last_commit_index())
    , sm_commit_index_(ctx->state_machine_->last_commit_index())
    , initial_commit_index_(ctx->state_machine_->last_commit_index())
    , hb_alive_(false)
    , election_completed_(true)
    , config_changing_(false)
    , catching_up_(false)
    , out_of_log_range_(false)
    , data_fresh_(false)
    , stopping_(false)
    , commit_bg_stopped_(false)
    , append_bg_stopped_(false)
    , write_paused_(false)
    , sm_commit_paused_(false)
    , sm_commit_exec_in_progress_(false)
    , ea_sm_commit_exec_in_progress_(new EventAwaiter())
    , next_leader_candidate_(-1)
    , im_learner_(false)
    , serving_req_(false)
    , steps_to_down_(0)
    , snp_in_progress_(false)
    , ctx_(ctx)
    , scheduler_(ctx->scheduler_)
    , election_exec_(std::bind(&raft_server::handle_election_timeout, this))
    , election_task_(nullptr)
    , role_(srv_role::follower)
    , state_(ctx->state_mgr_->read_state())
    , log_store_(ctx->state_mgr_->load_log_store())
    , state_machine_(ctx->state_machine_)
    , receiving_snapshot_(false)
    , et_cnt_receiving_snapshot_(0)
    , first_snapshot_distance_(0)
    , l_(ctx->logger_)
    , stale_config_(nullptr)
    , config_(ctx->state_mgr_->load_config())
    , uncommitted_config_(nullptr)
    , srv_to_join_(nullptr)
    , srv_to_join_snp_retry_required_(false)
    , srv_to_leave_(nullptr)
    , srv_to_leave_target_idx_(0)
    , conf_to_add_(nullptr)
    , resp_handler_( (rpc_handler)std::bind( &raft_server::handle_peer_resp,
                                             this,
                                             std::placeholders::_1,
                                             std::placeholders::_2 ) )
    , ex_resp_handler_( (rpc_handler)std::bind( &raft_server::handle_ext_resp,
                                                this,
                                                std::placeholders::_1,
                                                std::placeholders::_2 ) )
    , last_snapshot_(ctx->state_machine_->last_snapshot())
    , ea_follower_log_append_(new EventAwaiter())
    , test_mode_flag_(opt.test_mode_flag_)
{
    if (opt.raft_callback_) {
        ctx->set_cb_func(opt.raft_callback_);
    }

    ptr<raft_params> params = ctx_->get_params();
    if (params->stale_log_gap_ < params->fresh_log_gap_) {
        params->stale_log_gap_ = params->fresh_log_gap_;
    }
    if (params->enable_randomized_snapshot_creation_ &&
        !get_last_snapshot() &&
        params->snapshot_distance_ > 1) {
        uint64_t seed = timer_helper::get_timeofday_us() * id_;

        // Flip the integer.
        auto* first = reinterpret_cast<uint8_t*>(&seed);
        auto* last = reinterpret_cast<uint8_t*>(&seed) + sizeof(seed);
        while ((first != last) && (first != -- last)) std::swap(*first++, *last);

        std::default_random_engine engine(seed);
        std::uniform_int_distribution<int32>
            distribution( params->snapshot_distance_ / 2,
                          std::max( params->snapshot_distance_ / 2,
                                    params->snapshot_distance_ - 1 ) );

        first_snapshot_distance_ = distribution(engine);
        p_in("First snapshot creation log distance %u", first_snapshot_distance_);
    }

    apply_and_log_current_params();
    update_rand_timeout();
    precommit_index_ = log_store_->next_slot() - 1;
    lagging_sm_target_index_ = log_store_->next_slot() - 1;

    if (!state_) {
        state_ = cs_new<srv_state>();
        state_->set_term(0);
        state_->set_voted_for(-1);
    }
    vote_init_timer_term_ = state_->get_term();

    ptr<cluster_config> c_conf = get_config();
    std::stringstream init_msg;
    init_msg << "   === INIT RAFT SERVER ===\n"
             << "commit index " << sm_commit_index_ << "\n"
             << "term " << state_->get_term() << "\n"
             << "election timer " << ( state_->is_election_timer_allowed()
                                       ? "allowed" : "not allowed" ) << "\n"
             << "log store start " << log_store_->start_index()
             << ", end " << log_store_->next_slot() - 1 << "\n"
             << "config log idx " << c_conf->get_log_idx()
             << ", prev log idx " << c_conf->get_prev_log_idx() << "\n";
    if (c_conf->is_async_replication()) {
        init_msg << " -- ASYNC REPLICATION --\n";
    }
    p_in("%s", init_msg.str().c_str());

    /**
     * I found this implementation is also a victim of bug
     *     https://groups.google.com/forum/#!topic/raft-dev/t4xj6dJTP6E
     * As the implementation is based on Diego's thesis
     *
     * Fix:
     * We should never load configurations that is not committed,
     * this prevents an old server from replicating an obsoleted config to
     * other servers.
     *
     * The prove is as below:
     * Assume S0 is the last committed server set for the old server A
     * |- EXITS Log l which has been committed but l !BELONGS TO A.logs
     *     =>  Vote(A) < Majority(S0)
     * In other words, we need to prove that A cannot be elected to leader
     * if any logs/configs has been committed.
     *
     * Case #1, There is no configuration change since S0, then it's
     *          obvious that
     *          Vote(A) < Majority(S0), see the core Algorithm.
     * Case #2, There are one or more configuration changes since S0,
     *          then at the time of first configuration change was
     *          committed, there are at least Majority(S0 - 1) servers
     *          committed the configuration change
     *          Majority(S0 - 1) + Majority(S0) > S0 => Vote(A) < Majority(S0)
     * -|
     */
    for ( ulong i = std::max( sm_commit_index_ + 1,
                              log_store_->start_index() );
          i < log_store_->next_slot();
          ++i ) {
        auto const entry = log_store_->entry_at(i);
        if (entry->get_val_type() == log_val_type::conf) {
            p_in( "detect a configuration change "
                  "that is not committed yet at index %" PRIu64 "", i );
            config_changing_ = true;
            break;
        }
    }

    std::stringstream peer_info_msg;
    auto srvs_end = c_conf->get_servers().end();
    for (auto it = c_conf->get_servers().begin(); it != srvs_end; ++it) {
        ptr<srv_config> cur_srv = *it;
        if (cur_srv->get_id() != id_) {
            timer_task<int32>::executor exec =
                (timer_task<int32>::executor)
                std::bind( &raft_server::handle_hb_timeout,
                           this,
                           std::placeholders::_1 );
            peers_.insert( std::make_pair
                           ( cur_srv->get_id(),
                             cs_new< peer,
                                     ptr<srv_config>&,
                                     context&,
                                     timer_task<int32>::executor&,
                                     ptr<logger>& >
                                   ( cur_srv, *ctx_, exec, l_ ) ) );
        } else {
            // Myself.
            im_learner_ = cur_srv->is_learner();
            my_priority_ = cur_srv->get_priority();
        }

        // WARNING:
        //   We should set the initial target priority to 1.
        //   When multiple nodes are gone at the same time and
        //   then re-started, and if some nodes cannot decay the
        //   target priority, we can never elect new leader.
        //
        //   (The reason why some nodes cannot decay is because
        //    request vote message resets election timer.)
        //
        // target_priority_ = std::max( target_priority_,
        //                              cur_srv->get_priority() );

        peer_info_msg
            << "peer " << cur_srv->get_id()
            << ": DC ID " << cur_srv->get_dc_id()
            << ", " << cur_srv->get_endpoint()
            << ", " << (cur_srv->is_learner() ? "learner" : "voting member")
            << ", " << cur_srv->get_priority()
            << std::endl;
    }

    peer_info_msg << "my id: " << id_
                  << ", " << ((im_learner_) ? "learner" : "voting_member")
                  << std::endl;
    peer_info_msg << "num peers: " << peers_.size() << std::endl;
    p_in("%s", peer_info_msg.str().c_str());

    if (opt.start_server_in_constructor_) {
        start_server(opt.skip_initial_election_timeout_);
    }
}